

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O2

QList<QAsn1Element> * __thiscall
QAsn1Element::toList(QList<QAsn1Element> *__return_storage_ptr__,QAsn1Element *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  long in_FS_OFFSET;
  QAsn1Element local_68;
  QArrayDataPointer<char> local_48;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QAsn1Element *)0x0;
  if (this->mType == '0') {
    local_48.d = (Data *)0x0;
    local_48.ptr = (char *)0x0;
    local_48.size = 0;
    local_68.mType = '\0';
    local_68._1_7_ = 0xaaaaaaaaaaaaaa;
    local_68.mValue.d.d = (Data *)0x0;
    local_68.mValue.d.ptr = (char *)0x0;
    local_68.mValue.d.size = 0;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
    local_48.size = -0x5555555555555556;
    uStack_30 = 0xaaaaaaaaaaaaaaaa;
    local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_48.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    QDataStream::QDataStream((QDataStream *)&local_48,&this->mValue);
    __buf = extraout_RDX;
    while( true ) {
      sVar1 = read(&local_68,(int)&local_48,__buf,in_RCX);
      if ((char)sVar1 == '\0') break;
      QList<QAsn1Element>::emplaceBack<QAsn1Element_const&>(__return_storage_ptr__,&local_68);
      __buf = extraout_RDX_00;
    }
    QDataStream::~QDataStream((QDataStream *)&local_48);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_68.mValue.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QAsn1Element> QAsn1Element::toList() const
{
    QList<QAsn1Element> items;
    if (mType == SequenceType) {
        QAsn1Element elem;
        QDataStream stream(mValue);
        while (elem.read(stream))
            items << elem;
    }
    return items;
}